

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QTzTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTzTimeZonePrivate *this,Territory territory)

{
  byte bVar1;
  Entry *pEVar2;
  storage_type *psVar3;
  bool bVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *this_00;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  long lVar12;
  iterator iVar13;
  QByteArrayView *pQVar14;
  long lVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_98;
  QArrayDataPointer<QByteArray> local_78;
  piter local_58;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)__return_storage_ptr__);
  local_58 = (piter)QHash<QByteArray,_QTzTimeZone>::cbegin
                              ((QHash<QByteArray,_QTzTimeZone> *)this_00);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->(this_00);
  while( true ) {
    if (local_58.d == (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0 &&
        (QByteArrayView *)local_58.bucket == (QByteArrayView *)0x0) break;
    pEVar2 = (local_58.d)->spans[local_58.bucket >> 7].entries;
    bVar1 = (local_58.d)->spans[local_58.bucket >> 7].offsets[(uint)local_58.bucket & 0x7f];
    if (*(Territory *)(pEVar2[bVar1].storage.data + 0x18) == territory) {
      QList<QByteArray>::emplaceBack<QByteArray_const&>
                (__return_storage_ptr__,(QByteArray *)(pEVar2 + bVar1));
    }
    QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_QTzTimeZone>_>::operator++(&local_58);
  }
  iVar5 = QList<QByteArray>::begin(__return_storage_ptr__);
  iVar6 = QList<QByteArray>::end(__return_storage_ptr__);
  std::__sort<QList<QByteArray>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar5.i,iVar6.i);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZonePrivate::matchingTimeZoneIds
            ((QList<QByteArrayView> *)&local_58,&this->super_QTimeZonePrivate,territory);
  iVar7 = QList<QByteArrayView>::begin((QList<QByteArrayView> *)&local_58);
  iVar8 = QList<QByteArrayView>::end((QList<QByteArrayView> *)&local_58);
  std::__sort<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar7.i,iVar8.i);
  iVar7 = QList<QByteArrayView>::begin((QList<QByteArrayView> *)&local_58);
  iVar8 = QList<QByteArrayView>::end((QList<QByteArrayView> *)&local_58);
  iVar7 = std::__unique<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (iVar7.i,iVar8.i);
  iVar8 = QList<QByteArrayView>::begin((QList<QByteArrayView> *)&local_58);
  local_98.d = (Data *)CONCAT62(local_98.d._2_6_,territory);
  local_78.d = (Data *)CONCAT62(local_78.d._2_6_,territory);
  lVar15 = (long)iVar7.i - (long)iVar8.i;
  for (lVar12 = lVar15 >> 6; iVar11 = iVar7, iVar13.i = iVar8.i, 0 < lVar12; lVar12 = lVar12 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8);
    if (bVar4) goto LAB_003b4d25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8.i + 1);
    iVar13.i = iVar8.i + 1;
    if (bVar4) goto LAB_003b4d25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8.i + 2);
    iVar13.i = iVar8.i + 2;
    if (bVar4) goto LAB_003b4d25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8.i + 3);
    iVar13.i = iVar8.i + 3;
    if (bVar4) goto LAB_003b4d25;
    iVar8.i = iVar8.i + 4;
    lVar15 = lVar15 + -0x40;
  }
  lVar15 = lVar15 >> 4;
  if (lVar15 == 1) {
LAB_003b4d0f:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8);
    iVar13.i = iVar8.i;
    if (!bVar4) {
      iVar13 = iVar7;
    }
  }
  else if (lVar15 == 2) {
LAB_003b4cfa:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8);
    iVar13.i = iVar8.i;
    if (!bVar4) {
      iVar8.i = iVar8.i + 1;
      goto LAB_003b4d0f;
    }
  }
  else {
    if (lVar15 != 3) goto LAB_003b4d5d;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar8);
    if (!bVar4) {
      iVar8.i = iVar8.i + 1;
      goto LAB_003b4cfa;
    }
  }
LAB_003b4d25:
  if (iVar13.i != iVar7.i) {
    iVar11.i = iVar13.i;
    while (pQVar14 = iVar13.i, iVar13.i = pQVar14 + 1, iVar13.i != iVar7.i) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_98,iVar13);
      if (!bVar4) {
        psVar3 = pQVar14[1].m_data;
        (iVar11.i)->m_size = (iVar13.i)->m_size;
        (iVar11.i)->m_data = psVar3;
        iVar11.i = iVar11.i + 1;
      }
    }
  }
LAB_003b4d5d:
  iVar7 = QList<QByteArrayView>::begin((QList<QByteArrayView> *)&local_58);
  if ((long)iVar11.i - (long)iVar7.i != 0) {
    lVar12 = (long)iVar11.i - (long)iVar7.i >> 4;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QByteArray *)0x0;
    local_78.size = 0;
    QList<QByteArray>::reserve((QList<QByteArray> *)&local_78,lVar12);
    iVar7 = QList<QByteArrayView>::begin((QList<QByteArrayView> *)&local_58);
    for (; iVar7.i != iVar11.i; iVar7.i = iVar7.i + 1) {
      QByteArrayView::toByteArray((QByteArray *)&local_98,iVar7.i);
      QList<QByteArray>::emplaceBack<QByteArray>
                ((QList<QByteArray> *)&local_78,(QByteArray *)&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    }
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QByteArray *)0x0;
    QList<QByteArray>::reserve
              ((QList<QByteArray> *)&local_98,lVar12 + (__return_storage_ptr__->d).size);
    iVar5 = QList<QByteArray>::begin(__return_storage_ptr__);
    iVar6 = QList<QByteArray>::end(__return_storage_ptr__);
    iVar9 = QList<QByteArray>::begin((QList<QByteArray> *)&local_78);
    iVar10 = QList<QByteArray>::end((QList<QByteArray> *)&local_78);
    std::
    __set_union<QList<QByteArray>::iterator,QList<QByteArray>::iterator,std::back_insert_iterator<QList<QByteArray>>,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i,iVar9.i,iVar10.i,&local_98);
    QArrayDataPointer<QByteArray>::operator=(&__return_storage_ptr__->d,&local_98);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<QByteArrayView>::~QArrayDataPointer
            ((QArrayDataPointer<QByteArrayView> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    QList<QByteArray> result;
    for (auto it = tzZones->cbegin(), end = tzZones->cend(); it != end; ++it) {
        if (it.value().territory == territory)
            result << it.key();
    }
    std::sort(result.begin(), result.end());

    // Since zone.tab only knows about one territory per zone, and is somewhat
    // incomplete, we may well miss some zones that CLDR associates with the
    // territory. So merge with those from CLDR that we do support.
    const auto unWantedZone = [territory](QByteArrayView id) {
        // We only want to add zones if they are known and we don't already have them:
        auto it = tzZones->constFind(id);
        return it == tzZones->end() || it->territory == territory;
    };
    QList<QByteArrayView> cldrViews = matchingTimeZoneIds(territory);
    std::sort(cldrViews.begin(), cldrViews.end());
    const auto uniqueEnd = std::unique(cldrViews.begin(), cldrViews.end());
    const auto prunedEnd = std::remove_if(cldrViews.begin(), uniqueEnd, unWantedZone);
    const auto cldrSize = std::distance(cldrViews.begin(), prunedEnd);
    if (cldrSize) {
        QList<QByteArray> cldrList;
        cldrList.reserve(cldrSize);
        for (auto it = cldrViews.begin(); it != prunedEnd; ++it)
            cldrList.emplace_back(it->toByteArray());
        QList<QByteArray> joined;
        joined.reserve(result.size() + cldrSize);
        std::set_union(result.begin(), result.end(), cldrList.begin(), cldrList.end(),
                       std::back_inserter(joined));
        result = joined;
    }

    return result;
}